

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspm.cpp
# Opt level: O1

void __thiscall pg::MSPMSolver::run(MSPMSolver *this)

{
  uint64_t *puVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  long *plVar9;
  ostream *poVar10;
  Game *pGVar11;
  Error *pEVar12;
  ulong uVar13;
  long lVar14;
  int from;
  char *pcVar15;
  int iVar16;
  int from_1;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  bool bVar21;
  int from_2;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  int local_94;
  int *local_90;
  _Deque_base<int,_std::allocator<int>_> local_88;
  
  pGVar11 = (this->super_Solver).game;
  lVar14 = pGVar11->n_vertices;
  lVar20 = (long)*(int *)((long)pGVar11->_priority + ((lVar14 << 0x20) + -0x100000000 >> 0x1e));
  this->k = (int)(lVar20 + 1);
  uVar4 = lVar14 * (lVar20 + 1);
  local_90 = (int *)operator_new__(-(ulong)(uVar4 >> 0x3e != 0) | uVar4 * 4);
  this->pms = local_90;
  piVar5 = (int *)operator_new__(-(ulong)((ulong)pGVar11->n_vertices >> 0x3e != 0) |
                                 pGVar11->n_vertices << 2);
  this->strategy = piVar5;
  uVar4 = 0xffffffffffffffff;
  if (-2 < lVar20) {
    uVar4 = lVar20 * 4 + 4;
  }
  piVar6 = (int *)operator_new__(uVar4);
  this->counts = piVar6;
  piVar7 = (int *)operator_new__(-(ulong)((ulong)pGVar11->n_vertices >> 0x3e != 0) |
                                 pGVar11->n_vertices << 2);
  this->cover = piVar7;
  piVar8 = (int *)operator_new__(uVar4);
  this->tmp = piVar8;
  piVar8 = (int *)operator_new__(uVar4);
  this->best = piVar8;
  uVar4 = pGVar11->n_vertices;
  lVar14 = (long)this->k * uVar4;
  if (0 < lVar14) {
    memset(local_90,0,lVar14 * 4);
  }
  if (0 < (long)uVar4) {
    memset(piVar5,0xff,uVar4 * 4);
    puVar1 = ((this->super_Solver).disabled)->_bits;
    uVar13 = 0;
    do {
      bVar21 = (puVar1[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0;
      piVar7[uVar13] = (bVar21 - 2) + (uint)bVar21;
      uVar13 = uVar13 + 1;
    } while (uVar4 != uVar13);
  }
  if (0 < (long)this->k) {
    memset(piVar6,0,(long)this->k << 2);
  }
  if (0 < (long)uVar4) {
    uVar13 = 0;
    do {
      if (piVar7[uVar13] == 0) {
        piVar6[pGVar11->_priority[uVar13]] = piVar6[pGVar11->_priority[uVar13]] + 1;
      }
      uVar13 = uVar13 + 1;
    } while (uVar4 != uVar13);
  }
  this->lift_attempt = 0;
  this->lift_count = 0;
  uVar13 = 0xffffffffffffffff;
  if (uVar4 < 0x4000000000000000) {
    uVar13 = uVar4 * 4;
  }
  piVar5 = (int *)operator_new__(uVar13);
  this->dirty = piVar5;
  lVar14 = pGVar11->n_vertices;
  if (0 < lVar14) {
    memset(piVar5,0,lVar14 * 4);
  }
  this->coverdepth = 0;
  uVar19 = (int)lVar14 - 1;
  if (-1 < (int)uVar19) {
    uVar4 = (ulong)uVar19;
    do {
      if (this->cover[uVar4] == 0) {
        bVar21 = lift(this,(int)uVar4,-1);
      }
      else {
        bVar21 = false;
      }
      if ((bVar21 != false) || (this->cover[uVar4] == -1)) {
        pGVar11 = (this->super_Solver).game;
        piVar5 = pGVar11->_inedges;
        lVar14 = (long)pGVar11->_firstins[uVar4];
        iVar3 = piVar5[lVar14];
        if (iVar3 != -1) {
          piVar5 = piVar5 + lVar14 + 1;
          do {
            if ((this->cover[iVar3] == 0) && (bVar21 = lift(this,iVar3,(int)uVar4), bVar21)) {
              todo_push(this,iVar3);
            }
            iVar3 = *piVar5;
            piVar5 = piVar5 + 1;
          } while (iVar3 != -1);
        }
      }
      bVar21 = 0 < (long)uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar21);
  }
  do {
    if ((this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur ==
        (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
        _M_start._M_cur) {
      if (((this->super_Solver).trace != 0) && (0 < ((this->super_Solver).game)->n_vertices)) {
        uVar4 = 0;
        do {
          poVar10 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\x1b[1;31mnode ",0xc);
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)uVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"/",1);
          poVar10 = (ostream *)
                    std::ostream::operator<<(poVar10,((this->super_Solver).game)->_priority[uVar4]);
          bVar21 = ((((this->super_Solver).game)->_owner)._bits[uVar4 >> 6] >> (uVar4 & 0x3f) & 1)
                   != 0;
          pcVar15 = " (odd)";
          if (!bVar21) {
            pcVar15 = " (even)";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar15,7 - (ulong)bVar21);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\x1b[m is",6);
          pm_stream(this,(this->super_Solver).logger,this->pms + (long)(int)uVar4 * (long)this->k);
          if (-1 < this->cover[uVar4]) {
            poVar10 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," cover: ",8);
            std::ostream::operator<<(poVar10,this->cover[uVar4]);
          }
          poVar10 = (this->super_Solver).logger;
          cVar2 = (char)poVar10;
          std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
          uVar4 = uVar4 + 1;
        } while ((long)uVar4 < ((this->super_Solver).game)->n_vertices);
      }
      pGVar11 = (this->super_Solver).game;
      if (0 < pGVar11->n_vertices) {
        uVar4 = 0;
        do {
          if ((((this->super_Solver).disabled)->_bits[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0) {
            lVar14 = (long)(int)uVar4 * (long)this->k;
            iVar3 = this->pms[lVar14];
            if ((iVar3 == -1) != (this->pms[lVar14 + 1] != -1)) {
              pEVar12 = (Error *)__cxa_allocate_exception(0x40);
              Error::Error(pEVar12,"logic error",
                           "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/mspm.cpp"
                           ,0x204);
              __cxa_throw(pEVar12,&Error::typeinfo,Error::~Error);
            }
            iVar17 = -1;
            if ((((pGVar11->_owner)._bits[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0) == (iVar3 != -1))
            {
              iVar17 = this->strategy[uVar4];
            }
            Oink::solve((this->super_Solver).oink,(int)uVar4,(uint)(iVar3 != -1),iVar17);
          }
          uVar4 = uVar4 + 1;
          pGVar11 = (this->super_Solver).game;
        } while ((long)uVar4 < pGVar11->n_vertices);
      }
      if (this->pms != (int *)0x0) {
        operator_delete__(this->pms);
      }
      if (this->strategy != (int *)0x0) {
        operator_delete__(this->strategy);
      }
      if (this->counts != (int *)0x0) {
        operator_delete__(this->counts);
      }
      if (this->cover != (int *)0x0) {
        operator_delete__(this->cover);
      }
      if (this->dirty != (int *)0x0) {
        operator_delete__(this->dirty);
      }
      if (this->tmp != (int *)0x0) {
        operator_delete__(this->tmp);
      }
      if (this->best != (int *)0x0) {
        operator_delete__(this->best);
      }
      poVar10 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"solved with ",0xc);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,this->lift_count);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," lifts, ",8);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,this->lift_attempt);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," lift attempts.",0xf);
      std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      return;
    }
    iVar3 = todo_pop(this);
    if (this->cover[iVar3] + 1U < 2) {
      pGVar11 = (this->super_Solver).game;
      piVar5 = pGVar11->_inedges;
      lVar14 = (long)pGVar11->_firstins[iVar3];
      iVar17 = piVar5[lVar14];
      if (iVar17 != -1) {
        piVar5 = piVar5 + lVar14 + 1;
        do {
          if ((this->cover[iVar17] == 0) && (bVar21 = lift(this,iVar17,iVar3), bVar21)) {
            todo_push(this,iVar17);
          }
          iVar17 = *piVar5;
          piVar5 = piVar5 + 1;
        } while (iVar17 != -1);
      }
    }
    while ((this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_cur ==
           (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_start._M_cur) {
      uVar19 = this->coverdepth;
      piVar5 = (int *)(ulong)uVar19;
      if (uVar19 == 0) break;
      this->coverdepth = uVar19 - 1;
      local_88._M_impl.super__Deque_impl_data._0_16_ = ZEXT816(0) << 0x40;
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (int *)0x0;
      local_88._M_impl.super__Deque_impl_data._M_start._M_first = (int *)0x0;
      local_88._M_impl.super__Deque_impl_data._M_start._M_last = (int *)0x0;
      local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (int *)0x0;
      local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_88,0);
      local_94 = 0;
      if (0 < ((this->super_Solver).game)->n_vertices) {
        lVar14 = 0;
        local_90 = piVar5;
        do {
          if (this->cover[lVar14] == (int)piVar5) {
            this->cover[lVar14] = 0;
            if ((this->super_Solver).trace != 0) {
              poVar10 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,"\x1b[7;31;1muncovering\x1b[m ",0x17);
              plVar9 = (long *)std::ostream::operator<<(poVar10,local_94);
              std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
              std::ostream::put((char)plVar9);
              std::ostream::flush();
            }
            uVar4 = (ulong)local_94;
            pGVar11 = (this->super_Solver).game;
            uVar13 = 1L << (uVar4 & 0x3f) & (pGVar11->_owner)._bits[uVar4 >> 6];
            iVar3 = pGVar11->_outedges[pGVar11->_firstouts[uVar4]];
            if (iVar3 == -1) {
              bVar21 = false;
            }
            else {
              piVar6 = pGVar11->_outedges + (long)pGVar11->_firstouts[uVar4] + 1;
              bVar21 = false;
              do {
                uVar4 = (ulong)iVar3;
                iVar17 = 0x26;
                if (this->cover[uVar4] != -2) {
                  pGVar11 = (this->super_Solver).game;
                  iVar17 = 0;
                  if (((pGVar11->solved)._bits[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0) {
                    bVar21 = true;
                  }
                  else if ((uVar13 != 0) !=
                           (((pGVar11->winner)._bits[uVar4 >> 6] & 1L << (uVar4 & 0x3f)) == 0)) {
                    Oink::solve((this->super_Solver).oink,local_94,(uint)(uVar13 != 0),iVar3);
                    this->cover[local_94] = -1;
                    this->pms[(int)(local_94 * this->k + (uint)(uVar13 != 0))] = -1;
                    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                        local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                      std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                                ((deque<int,std::allocator<int>> *)&local_88,&local_94);
                    }
                    else {
                      *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_94;
                      local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                           local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                    }
                    iVar17 = 0x24;
                    todo_push(this,local_94);
                  }
                }
                piVar5 = local_90;
                if ((iVar17 != 0x26) && (iVar17 != 0)) break;
                iVar3 = *piVar6;
                piVar6 = piVar6 + 1;
              } while (iVar3 != -1);
            }
            if (this->cover[local_94] != -1) {
              if (bVar21) {
                lift(this,local_94,-1);
              }
              else {
                Oink::solve((this->super_Solver).oink,local_94,(uint)(uVar13 == 0),-1);
                this->cover[local_94] = -1;
                this->pms[(int)(local_94 * this->k + (uint)(uVar13 == 0))] = -1;
                if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                  std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                            ((deque<int,std::allocator<int>> *)&local_88,&local_94);
                }
                else {
                  *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_94;
                  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                }
              }
              todo_push(this,local_94);
            }
          }
          lVar14 = (long)local_94 + 1;
          local_94 = (int)lVar14;
        } while (lVar14 < ((this->super_Solver).game)->n_vertices);
      }
      while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
        iVar3 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_88._M_impl.super__Deque_impl_data._M_start._M_last =
               local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80;
          local_88._M_impl.super__Deque_impl_data._M_start._M_first =
               local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_88._M_impl.super__Deque_impl_data._M_start._M_node =
               local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        uVar4 = (ulong)iVar3;
        pGVar11 = (this->super_Solver).game;
        if (((pGVar11->solved)._bits[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0) {
          pEVar12 = (Error *)__cxa_allocate_exception(0x40);
          Error::Error(pEVar12,"logic error",
                       "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/mspm.cpp"
                       ,0x1dc);
          __cxa_throw(pEVar12,&Error::typeinfo,Error::~Error);
        }
        if (pGVar11->_inedges[pGVar11->_firstins[uVar4]] != -1) {
          uVar18 = 1L << (uVar4 & 0x3f);
          uVar13 = (pGVar11->winner)._bits[uVar4 >> 6];
          piVar5 = pGVar11->_inedges + pGVar11->_firstins[uVar4];
          do {
            local_94 = *piVar5;
            uVar4 = (ulong)local_94;
            if (this->cover[uVar4] == 0) {
              pGVar11 = (this->super_Solver).game;
              iVar17 = iVar3;
              if ((((pGVar11->_owner)._bits[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0) ==
                  ((uVar13 & uVar18) != 0)) {
                iVar16 = pGVar11->_outedges[pGVar11->_firstouts[uVar4]];
                iVar17 = -1;
                if (iVar16 != -1) {
                  piVar6 = pGVar11->_outedges + (long)pGVar11->_firstouts[uVar4] + 1;
                  bVar21 = false;
                  do {
                    iVar16 = this->cover[iVar16];
                    if ((-1 < iVar16) && (bVar21 = true, iVar16 != 0)) {
                      pEVar12 = (Error *)__cxa_allocate_exception(0x40);
                      Error::Error(pEVar12,"logic error",
                                   "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/mspm.cpp"
                                   ,0x1e6);
                      __cxa_throw(pEVar12,&Error::typeinfo,Error::~Error);
                    }
                    if (-1 < iVar16) break;
                    iVar16 = *piVar6;
                    piVar6 = piVar6 + 1;
                  } while (iVar16 != -1);
                  if (bVar21) goto LAB_0016d59a;
                }
              }
              uVar19 = (uint)((uVar13 & uVar18) != 0);
              Oink::solve((this->super_Solver).oink,local_94,uVar19,iVar17);
              this->cover[local_94] = -1;
              this->pms[(int)(local_94 * this->k + uVar19)] = -1;
              if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                          ((deque<int,std::allocator<int>> *)&local_88,&local_94);
              }
              else {
                *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_94;
                local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
              todo_push(this,local_94);
            }
LAB_0016d59a:
            piVar6 = piVar5 + 1;
            piVar5 = piVar5 + 1;
          } while (*piVar6 != -1);
        }
      }
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_88);
    }
  } while( true );
}

Assistant:

void
MSPMSolver::run()
{
    // determine k = highest priority + 1
    k = priority(nodecount()-1)+1;

    // now create the data structure, for each node
    pms = new int[k*nodecount()];
    strategy = new int[nodecount()];
    counts = new int[k];
    cover = new int[nodecount()];
    tmp = new int[k];
    best = new int[k];

    // initialize all measures to 0
    for (int i=0; i<k*nodecount(); i++) pms[i] = 0;

    // initialize strategy to -1
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // initialize cover
    for (int i=0; i<nodecount(); i++) cover[i] = disabled[i] ? -2 : 0;

    // initialize counts for each priority
    for (int i=0; i<k; i++) counts[i] = 0;
    for (int i=0; i<nodecount(); i++) if (cover[i] == 0) counts[priority(i)]++;

    // set number of lifts and lift attempts to 0
    lift_count = lift_attempt = 0;

    /**
     * Strategy that updates predecessors then marks updated predecessors for processing.
     * Uses a queue/stack to store the dirty vertices.
     */

    // initialize all nodes as not dirty
    dirty = new int[nodecount()];
    for (int n=0; n<nodecount(); n++) dirty[n] = 0;

    // initialize cover depth to 0
    coverdepth = 0;

    /**
     * First loop, starting with standard "lift" for nodes and "liftR" for predecessors.
     * Can already find "Top" here, so add covered nodes to <deferred>.
     */
    for (int n=nodecount()-1; n>=0; n--) {
        bool lifted = cover[n] == 0 and lift(n, -1);
        if (cover[n] == -1 or lifted) {
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (cover[from] == 0 and lift(from, n)) todo_push(from);
            }
        }
    }

    /**
     * The main loop
     */

    while (!todo.empty()) {
        int n = todo_pop();
        if (cover[n] == -1 or cover[n] == 0) {
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (cover[from] == 0 and lift(from, n)) todo_push(from);
            }
        }

        while (todo.empty() and coverdepth != 0) {
            int m = coverdepth--;
            std::queue<int> q;

            for (int n=0; n<nodecount(); n++) {
                if (cover[n] != m) continue;
                cover[n] = 0;

                if (trace) logger << "\033[7;31;1muncovering\033[m " << n << std::endl;

                // try to see if it is attracted
                const int pl = owner(n);
                bool escapes = false;
                for (auto curedge = outs(n); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (cover[to] == -2) continue;
                    if (game.isSolved(to)) {
                        if (game.getWinner(to) == pl) {
                            Solver::solve(n, pl, to);
                            cover[n] = -1;
                            pms[k*n+pl] = -1;
                            q.push(n);
                            todo_push(n);
                            break;
                        }
                    } else {
                        escapes = true;
                    }
                }
                if (cover[n] == -1) continue;
                if (!escapes) {
                    Solver::solve(n, 1-pl, -1);
                    cover[n] = -1;
                    pms[k*n+(1-pl)] = -1;
                    q.push(n);
                    todo_push(n);
                    continue;
                }

                // not attracted, lift
                lift(n, -1);

                // TODO: always or only if lifted?
                todo_push(n);
            }

            // attract within uncovered area to <node> for <pl>
            while (!q.empty()) {
                int n = q.front();
                q.pop();
                if (!game.isSolved(n)) LOGIC_ERROR;
                const bool pl = game.getWinner(n);
                for (auto curedge = ins(n); *curedge != -1; curedge++) {
                    int from = *curedge;
                    if (cover[from]) continue;
                    if (owner(from) != pl) {
                        bool escapes = false;
                        for (auto curedge = outs(from); *curedge != -1; curedge++) {
                            int to = *curedge;
                            if (cover[to] < 0) continue;
                            if (cover[to] != 0) LOGIC_ERROR;
                            escapes = true;
                            break;
                        }
                        if (escapes) continue;
                    }
                    Solver::solve(from, pl, owner(from) == pl ? n : -1);
                    // counts[priority(node)]--;
                    cover[from] = -1;
                    pms[k*from+pl] = -1;
                    q.push(from);
                    todo_push(from);
                }
            }
        }
    }

    if (trace) {
        for (int n=0; n<nodecount(); n++) {
            logger << "\033[1;31mnode " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m is";
            pm_stream(logger, pms + k*n);
            if (cover[n] >= 0) logger << " cover: " << cover[n];
            logger << std::endl;
        }
    }

    // Now set dominions and derive strategy for even.
    for (int i=0; i<nodecount(); i++) {
        if (disabled[i]) continue;
        int *pm = pms + k*i;
        if ((pm[0] == -1) == (pm[1] == -1)) LOGIC_ERROR;
        const int winner = pm[0] == -1 ? 0 : 1;
        Solver::solve(i, winner, owner(i) == winner ? strategy[i] : -1);
    }

    delete[] pms;
    delete[] strategy;
    delete[] counts;
    delete[] cover;
    delete[] dirty;
    delete[] tmp;
    delete[] best;

    logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts." << std::endl;
}